

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytesinkutil.cpp
# Opt level: O0

void icu_63::ByteSinkUtil::appendCodePoint(int32_t length,UChar32 c,ByteSink *sink,Edits *edits)

{
  uint local_28;
  uint32_t __uc;
  int32_t s8Length;
  char s8 [4];
  Edits *edits_local;
  ByteSink *sink_local;
  UChar32 c_local;
  int32_t length_local;
  
  if ((uint)c < 0x80) {
    local_28 = 1;
    __uc._0_1_ = (byte)c;
  }
  else {
    if ((uint)c < 0x800) {
      __uc._0_1_ = (byte)((uint)c >> 6) | 0xc0;
      local_28 = 1;
    }
    else {
      if ((uint)c < 0x10000) {
        __uc._0_1_ = (byte)((uint)c >> 0xc) | 0xe0;
        local_28 = 1;
      }
      else {
        __uc._0_1_ = (byte)((uint)c >> 0x12) | 0xf0;
        __uc._1_1_ = (byte)((uint)c >> 0xc) & 0x3f | 0x80;
        local_28 = 2;
      }
      *(byte *)((long)&__uc + (long)(int)local_28) = (byte)((uint)c >> 6) & 0x3f | 0x80;
      local_28 = local_28 + 1;
    }
    *(byte *)((long)&__uc + (long)(int)local_28) = (byte)c & 0x3f | 0x80;
    local_28 = local_28 + 1;
  }
  _s8Length = edits;
  if (edits != (Edits *)0x0) {
    Edits::addReplace(edits,length,local_28);
  }
  (*sink->_vptr_ByteSink[2])(sink,&__uc,(ulong)local_28);
  return;
}

Assistant:

void
ByteSinkUtil::appendCodePoint(int32_t length, UChar32 c, ByteSink &sink, Edits *edits) {
    char s8[U8_MAX_LENGTH];
    int32_t s8Length = 0;
    U8_APPEND_UNSAFE(s8, s8Length, c);
    if (edits != nullptr) {
        edits->addReplace(length, s8Length);
    }
    sink.Append(s8, s8Length);
}